

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_validate.cc
# Opt level: O1

void VW::validate_version(vw *all)

{
  bool bVar1;
  vw_exception *this;
  version_struct *this_00;
  stringstream __msg;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  this_00 = &all->model_file_ver;
  bVar1 = version_struct::operator<(this_00,"7.6.0");
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_190,"Model has possibly incompatible version! ",0x29);
    version_struct::to_string_abi_cxx11_(&local_1e0,this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_190,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/vw_validate.cc"
               ,0xf,&local_1c0);
    __cxa_throw(this,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  bVar1 = version_struct::operator>(this_00,"8.6.1");
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Warning: model version is more recent than VW version.  This may not work.",0x4a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void validate_version(vw& all)
{
  if (all.model_file_ver < LAST_COMPATIBLE_VERSION)
    THROW("Model has possibly incompatible version! " << all.model_file_ver.to_string());
  if (all.model_file_ver > PACKAGE_VERSION)
    std::cerr << "Warning: model version is more recent than VW version.  This may not work." << std::endl;
}